

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvas_drawing.h
# Opt level: O1

void dlib::draw_line<int>(canvas *c,point *p1,point *p2,int *pixel,rectangle *area)

{
  int iVar1;
  unsigned_long uVar2;
  uchar *puVar3;
  ulong uVar4;
  uchar uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  double dVar20;
  rgb_alpha_pixel alpha_pixel;
  rgb_alpha_pixel local_64;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  lVar13 = (c->super_rectangle).l;
  lVar19 = (c->super_rectangle).t;
  lVar7 = area->l;
  if (area->l < lVar13) {
    lVar7 = lVar13;
  }
  lVar11 = area->t;
  if (area->t < lVar19) {
    lVar11 = lVar19;
  }
  lVar18 = (c->super_rectangle).r;
  if (area->r < lVar18) {
    lVar18 = area->r;
  }
  lVar10 = (c->super_rectangle).b;
  if (area->b < lVar10) {
    lVar10 = area->b;
  }
  lVar8 = (p1->
          super_matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
          ).data.data[0];
  lVar15 = (p1->
           super_matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
           ).data.data[1];
  lVar12 = (p2->
           super_matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
           ).data.data[0];
  lVar9 = (p2->
          super_matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
          ).data.data[1];
  uVar14 = lVar12 - lVar8;
  if (uVar14 == 0) {
    if (lVar7 <= lVar8 && lVar8 <= lVar18) {
      lVar7 = lVar9;
      if (lVar9 < lVar15) {
        lVar7 = lVar15;
        lVar15 = lVar9;
      }
      if (lVar15 <= lVar11) {
        lVar15 = lVar11;
      }
      if (lVar10 < lVar7) {
        lVar7 = lVar10;
      }
      if (lVar15 <= lVar7) {
        uVar2 = c->row_width;
        iVar1 = *pixel;
        iVar16 = 0;
        if (-1 < iVar1) {
          iVar16 = iVar1;
        }
        uVar5 = 0xff;
        if (iVar1 < 0x100) {
          uVar5 = (uchar)iVar16;
        }
        lVar7 = (lVar7 - lVar15) + 1;
        puVar3 = c->bits + (lVar15 - lVar19) * uVar2 + lVar8 * 4 + lVar13 * -4 + 2;
        do {
          *puVar3 = uVar5;
          puVar3[-1] = uVar5;
          puVar3[-2] = uVar5;
          puVar3 = puVar3 + uVar2;
          lVar7 = lVar7 + -1;
        } while (lVar7 != 0);
      }
    }
  }
  else {
    uVar17 = lVar9 - lVar15;
    if (uVar17 == 0) {
      if (lVar11 <= lVar15 && lVar15 <= lVar10) {
        lVar11 = lVar12;
        if (lVar12 < lVar8) {
          lVar11 = lVar8;
          lVar8 = lVar12;
        }
        if (lVar8 <= lVar7) {
          lVar8 = lVar7;
        }
        if (lVar18 < lVar11) {
          lVar11 = lVar18;
        }
        if (lVar8 <= lVar11) {
          puVar3 = c->bits;
          iVar1 = *pixel;
          iVar16 = 0;
          if (-1 < iVar1) {
            iVar16 = iVar1;
          }
          uVar5 = 0xff;
          if (iVar1 < 0x100) {
            uVar5 = (uchar)iVar16;
          }
          lVar13 = (lVar15 - lVar19) * c->row_width + lVar13 * -4;
          do {
            puVar3[lVar8 * 4 + lVar13 + 2] = uVar5;
            puVar3[lVar8 * 4 + lVar13 + 1] = uVar5;
            puVar3[lVar8 * 4 + lVar13] = uVar5;
            lVar8 = lVar8 + 1;
          } while (lVar11 + 1 != lVar8);
        }
      }
    }
    else {
      iVar1 = *pixel;
      iVar16 = 0;
      if (-1 < iVar1) {
        iVar16 = iVar1;
      }
      local_64.red = 0xff;
      if (iVar1 < 0x100) {
        local_64.red = (uchar)iVar16;
      }
      uVar4 = -uVar17;
      if (0 < (long)uVar17) {
        uVar4 = uVar17;
      }
      uVar6 = -uVar14;
      if (0 < (long)uVar14) {
        uVar6 = uVar14;
      }
      local_38 = (double)lVar8;
      local_40 = (double)lVar15;
      local_64.green = local_64.red;
      local_64.blue = local_64.red;
      if (uVar4 < uVar6) {
        lVar13 = lVar12;
        if (lVar8 < lVar12) {
          lVar13 = lVar8;
        }
        if (lVar12 < lVar8) {
          lVar12 = lVar8;
        }
        if (lVar13 <= lVar7) {
          lVar13 = lVar7;
        }
        local_60 = (double)lVar13;
        if (lVar18 < lVar12) {
          lVar12 = lVar18;
        }
        local_48 = (double)lVar12;
        if (local_60 <= local_48) {
          local_50 = (double)(long)uVar17 / (double)(long)uVar14;
          do {
            dVar20 = (local_60 - local_38) * local_50 + local_40;
            lVar13 = (long)dVar20;
            lVar19 = (long)local_60;
            if (lVar13 <= lVar10 && lVar11 <= lVar13) {
              local_64.alpha = (uchar)(int)((((double)lVar13 - dVar20) + 1.0) * 255.0);
              local_58 = dVar20;
              assign_pixel_helpers::assign<dlib::canvas::pixel,dlib::rgb_alpha_pixel>
                        ((pixel *)(c->bits +
                                  (lVar19 - (c->super_rectangle).l) * 4 +
                                  (lVar13 - (c->super_rectangle).t) * c->row_width),&local_64);
              dVar20 = local_58;
            }
            if (lVar13 < lVar10 && lVar11 <= lVar13 + 1) {
              local_64.alpha = (uchar)(int)((dVar20 - (double)lVar13) * 255.0);
              assign_pixel_helpers::assign<dlib::canvas::pixel,dlib::rgb_alpha_pixel>
                        ((pixel *)(c->bits +
                                  (lVar19 - (c->super_rectangle).l) * 4 +
                                  ((lVar13 + 1) - (c->super_rectangle).t) * c->row_width),&local_64)
              ;
            }
            local_60 = local_60 + 1.0;
          } while (local_60 <= local_48);
        }
      }
      else {
        lVar13 = lVar9;
        if (lVar15 < lVar9) {
          lVar13 = lVar15;
        }
        if (lVar9 < lVar15) {
          lVar9 = lVar15;
        }
        if (lVar13 <= lVar11) {
          lVar13 = lVar11;
        }
        local_60 = (double)lVar13;
        if (lVar10 < lVar9) {
          lVar9 = lVar10;
        }
        local_48 = (double)lVar9;
        if (local_60 <= local_48) {
          local_50 = (double)(long)uVar14 / (double)(long)uVar17;
          do {
            lVar19 = (long)local_60;
            dVar20 = (local_60 - local_40) * local_50 + local_38;
            lVar13 = (long)dVar20;
            if (lVar13 <= lVar18 && lVar7 <= lVar13) {
              local_64.alpha = (uchar)(int)((((double)lVar13 - dVar20) + 1.0) * 255.0);
              local_58 = dVar20;
              assign_pixel_helpers::assign<dlib::canvas::pixel,dlib::rgb_alpha_pixel>
                        ((pixel *)(c->bits +
                                  (lVar13 - (c->super_rectangle).l) * 4 +
                                  (lVar19 - (c->super_rectangle).t) * c->row_width),&local_64);
              dVar20 = local_58;
            }
            if (lVar13 < lVar18 && lVar7 <= lVar13 + 1) {
              local_64.alpha = (uchar)(int)((dVar20 - (double)lVar13) * 255.0);
              assign_pixel_helpers::assign<dlib::canvas::pixel,dlib::rgb_alpha_pixel>
                        ((pixel *)(c->bits +
                                  ((lVar13 + 1) - (c->super_rectangle).l) * 4 +
                                  (lVar19 - (c->super_rectangle).t) * c->row_width),&local_64);
            }
            local_60 = local_60 + 1.0;
          } while (local_60 <= local_48);
        }
      }
    }
  }
  return;
}

Assistant:

void draw_line (
        const canvas& c,
        const point& p1,
        const point& p2,
        const pixel_type& pixel, 
        const rectangle& area = rectangle(std::numeric_limits<long>::min(), std::numeric_limits<long>::min(),
                                          std::numeric_limits<long>::max(), std::numeric_limits<long>::max())
    )
    {
        rectangle valid_area(c.intersect(area));
        long x1 = p1.x();
        long y1 = p1.y();
        long x2 = p2.x();
        long y2 = p2.y();
        if (x1 == x2)
        {
            // if the x coordinate is inside the canvas's area
            if (x1 <= valid_area.right() && x1 >= valid_area.left())
            {
                // make sure y1 comes before y2
                if (y1 > y2)
                    swap(y1,y2);

                y1 = std::max(y1,valid_area.top());
                y2 = std::min(y2,valid_area.bottom());
                // this is a vertical line
                for (long y = y1; y <= y2; ++y)
                {
                    assign_pixel(c[y-c.top()][x1-c.left()], pixel);
                }
            }
        }
        else if (y1 == y2)
        {
            // if the y coordinate is inside the canvas's area
            if (y1 <= valid_area.bottom() && y1 >= valid_area.top())
            {
                // make sure x1 comes before x2
                if (x1 > x2)
                    swap(x1,x2);

                x1 = std::max(x1,valid_area.left());
                x2 = std::min(x2,valid_area.right());
                // this is a horizontal line
                for (long x = x1; x <= x2; ++x)
                {
                    assign_pixel(c[y1-c.top()][x-c.left()], pixel);
                }
            }
        }
        else
        {
            rgb_alpha_pixel alpha_pixel;
            assign_pixel(alpha_pixel, pixel);
            const unsigned char max_alpha = alpha_pixel.alpha;

            const long rise = (((long)y2) - ((long)y1));
            const long run = (((long)x2) - ((long)x1));
            if (std::abs(rise) < std::abs(run))
            {
                const double slope = ((double)rise)/run;

                double first, last;

                if (x1 > x2)                
                {
                    first = std::max(x2,valid_area.left());
                    last = std::min(x1,valid_area.right());
                }
                else
                {
                    first = std::max(x1,valid_area.left());
                    last = std::min(x2,valid_area.right());
                }                             


                long y;
                long x;
                const double x1f = x1;
                const double y1f = y1;
                for (double i = first; i <= last; ++i)
                {   
                    const double dy = slope*(i-x1f) + y1f;
                    const double dx = i;

                    y = static_cast<long>(dy);
                    x = static_cast<long>(dx);


                    if (y >= valid_area.top() && y <= valid_area.bottom())
                    {
                        alpha_pixel.alpha = static_cast<unsigned char>((1.0-(dy-y))*max_alpha);
                        assign_pixel(c[y-c.top()][x-c.left()], alpha_pixel);
                    }
                    if (y+1 >= valid_area.top() && y+1 <= valid_area.bottom())
                    {
                        alpha_pixel.alpha = static_cast<unsigned char>((dy-y)*max_alpha);
                        assign_pixel(c[y+1-c.top()][x-c.left()], alpha_pixel);
                    }
                }         
            }
            else
            {
                const double slope = ((double)run)/rise;

                double first, last;

                if (y1 > y2)                
                {
                    first = std::max(y2,valid_area.top());
                    last = std::min(y1,valid_area.bottom());
                }
                else
                {
                    first = std::max(y1,valid_area.top());
                    last = std::min(y2,valid_area.bottom());
                }                             

                long x;
                long y;
                const double x1f = x1;
                const double y1f = y1;
                for (double i = first; i <= last; ++i)
                {   
                    const double dx = slope*(i-y1f) + x1f;
                    const double dy = i;

                    y = static_cast<long>(dy);
                    x = static_cast<long>(dx);

                    if (x >= valid_area.left() && x <= valid_area.right())
                    {
                        alpha_pixel.alpha = static_cast<unsigned char>((1.0-(dx-x))*max_alpha);
                        assign_pixel(c[y-c.top()][x-c.left()], alpha_pixel);
                    }
                    if (x+1 >= valid_area.left() && x+1 <= valid_area.right())
                    {
                        alpha_pixel.alpha = static_cast<unsigned char>((dx-x)*max_alpha);
                        assign_pixel(c[y-c.top()][x+1-c.left()], alpha_pixel);
                    }
                } 
            }
        }

    }